

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMatrixSolver.cpp
# Opt level: O0

void __thiscall
TPZMatrixSolver<Fad<float>_>::TPZMatrixSolver
          (TPZMatrixSolver<Fad<float>_> *this,void **vtt,TPZMatrixSolver<Fad<float>_> *Source)

{
  TPZAutoPointer<TPZMatrix<Fad<float>_>_> *in_RSI;
  undefined8 *in_RDI;
  TPZAutoPointer<TPZMatrix<Fad<float>_>_> *copy;
  void **in_stack_ffffffffffffffb8;
  TPZAutoPointer<TPZMatrix<Fad<float>_>_> *this_00;
  TPZFMatrix<Fad<float>_> *in_stack_ffffffffffffffe0;
  
  TPZSolver::TPZSolver((TPZSolver *)in_RSI,in_stack_ffffffffffffffb8);
  *in_RDI = in_RSI->fRef;
  TPZAutoPointer<TPZMatrix<Fad<float>_>_>::TPZAutoPointer(in_RSI);
  this_00 = (TPZAutoPointer<TPZMatrix<Fad<float>_>_> *)(in_RDI + 2);
  TPZFMatrix<Fad<float>_>::TPZFMatrix(in_stack_ffffffffffffffe0);
  copy = (TPZAutoPointer<TPZMatrix<Fad<float>_>_> *)(in_RDI + 0x14);
  TPZAutoPointer<TPZMatrix<Fad<float>_>_>::TPZAutoPointer(in_RSI);
  TPZAutoPointer<TPZMatrix<Fad<float>_>_>::operator=(this_00,copy);
  TPZAutoPointer<TPZMatrix<Fad<float>_>_>::operator=(this_00,copy);
  return;
}

Assistant:

TPZMatrixSolver<TVar>::TPZMatrixSolver(const TPZMatrixSolver<TVar> &Source) :
fScratch()
{
	fReferenceMatrix = Source.fReferenceMatrix;
	fContainer = Source.fContainer;
}